

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O0

c_int update_linsys_solver_rho_vec_qdldl(qdldl_solver *s,c_float *rho_vec)

{
  QDLDL_int QVar1;
  QDLDL_int *unaff_RBX;
  QDLDL_float *in_RSI;
  QDLDL_int *in_RDI;
  QDLDL_bool *unaff_R12;
  QDLDL_int *unaff_R13;
  QDLDL_float *unaff_R14;
  c_int i;
  QDLDL_float *in_stack_ffffffffffffffb8;
  QDLDL_float *D;
  
  for (D = (QDLDL_float *)0x0; (long)D < in_RDI[0xf]; D = (QDLDL_float *)((long)D + 1)) {
    *(double *)(in_RDI[0xb] + (long)D * 8) = 1.0 / in_RSI[(long)D];
  }
  update_KKT_param2((csc *)in_RDI[0x12],(c_float *)in_RDI[0xb],(c_int *)in_RDI[0x15],in_RDI[0xf]);
  QVar1 = QDLDL_factor(in_RDI[0x1a],(QDLDL_int *)in_RDI[0x17],(QDLDL_int *)in_RDI[0x18],
                       (QDLDL_float *)in_RDI[7],(QDLDL_int *)in_RDI[0x16],
                       *(QDLDL_int **)(in_RDI[6] + 0x28),in_stack_ffffffffffffffb8,D,in_RSI,in_RDI,
                       unaff_RBX,unaff_R12,unaff_R13,unaff_R14);
  return (long)(int)(uint)(QVar1 < 0);
}

Assistant:

c_int update_linsys_solver_rho_vec_qdldl(qdldl_solver * s, const c_float * rho_vec){
    c_int i;

    // Update internal rho_inv_vec
    for (i = 0; i < s->m; i++){
        s->rho_inv_vec[i] = 1. / rho_vec[i];
    }

    // Update KKT matrix with new rho_vec
    update_KKT_param2(s->KKT, s->rho_inv_vec, s->rhotoKKT, s->m);

    return (QDLDL_factor(s->KKT->n, s->KKT->p, s->KKT->i, s->KKT->x,
        s->L->p, s->L->i, s->L->x, s->D, s->Dinv, s->Lnz,
        s->etree, s->bwork, s->iwork, s->fwork) < 0);
}